

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

void __thiscall
entityx::ComponentHelper<B>::copy_component_to(ComponentHelper<B> *this,Entity source,Entity target)

{
  long lVar1;
  Family FVar2;
  ulong uVar3;
  ComponentHandle<B,_entityx::EntityManager> CVar4;
  
  CVar4 = EntityManager::component<B,void>(source.manager_,source.id_.id_);
  FVar2 = Component<B>::family();
  lVar1 = *(long *)(*(long *)(CVar4.manager_ + 0x18) + FVar2 * 8);
  uVar3 = CVar4.id_.id_.id_ & 0xffffffff;
  EntityManager::assign<B,B_const&>
            (target.manager_,target.id_.id_,
             (B *)((uVar3 % *(ulong *)(lVar1 + 0x28)) * *(long *)(lVar1 + 0x20) +
                  *(long *)(*(long *)(lVar1 + 8) + (uVar3 / *(ulong *)(lVar1 + 0x28)) * 8)));
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }